

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  uint32_t *puVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  secp256k1_scalar s;
  secp256k1_scalar local_38;
  
  puVar7 = (uint32_t *)CONCAT44(in_register_00000034,len);
  local_38.d._0_8_ = *(undefined8 *)puVar7;
  local_38.d._8_8_ = *(undefined8 *)(puVar7 + 2);
  local_38.d._16_8_ = *(undefined8 *)(puVar7 + 4);
  local_38.d._24_8_ = *(undefined8 *)(puVar7 + 6);
  uVar5 = 0;
  memset(wnaf,0,0x400);
  iVar8 = 1;
  if ((long)local_38.d._24_8_ < 0) {
    secp256k1_scalar_negate(&local_38,&local_38);
    iVar8 = -1;
  }
  iVar2 = (int)a;
  uVar3 = 0xffffffff;
  uVar6 = 0;
  do {
    uVar10 = uVar6 >> 5;
    uVar9 = local_38.d[uVar10] >> ((byte)uVar6 & 0x1f);
    if ((uVar9 & 1) == uVar5) {
      uVar9 = uVar6 + 1;
    }
    else {
      iVar4 = 0x100 - uVar6;
      if (iVar2 <= (int)(0x100 - uVar6)) {
        iVar4 = iVar2;
      }
      if ((uVar6 + iVar4) - 1 >> 5 != uVar10) {
        bVar1 = (byte)uVar6 & 0x1f;
        uVar9 = local_38.d[uVar10] >> bVar1 | local_38.d[(ulong)uVar10 + 1] << 0x20 - bVar1;
      }
      uVar3 = (~(-1 << ((byte)iVar4 & 0x1f)) & uVar9) + uVar5;
      bVar11 = (uVar3 >> (iVar2 - 1U & 0x1f) & 1) != 0;
      uVar5 = (uint)bVar11;
      wnaf[(int)uVar6] = (uVar3 - ((uint)bVar11 << ((byte)a & 0x1f))) * iVar8;
      uVar9 = iVar4 + uVar6;
      uVar3 = uVar6;
    }
    uVar6 = uVar9;
  } while ((int)uVar6 < 0x100);
  return uVar3 + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s = *a;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}